

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O1

bool __thiscall GlobOptBlockData::IsLive(GlobOptBlockData *this,Sym *sym)

{
  BOOLEAN BVar1;
  StackSym *pSVar2;
  bool bVar3;
  
  pSVar2 = StackSym::GetVarEquivStackSym_NoCreate(sym);
  if (pSVar2 == (StackSym *)0x0) {
    bVar3 = false;
  }
  else {
    BVar1 = BVSparse<Memory::JitArenaAllocator>::Test(this->liveVarSyms,(pSVar2->super_Sym).m_id);
    bVar3 = true;
    if (BVar1 == '\0') {
      BVar1 = BVSparse<Memory::JitArenaAllocator>::Test
                        (this->liveInt32Syms,(pSVar2->super_Sym).m_id);
      if (BVar1 == '\0') {
        BVar1 = BVSparse<Memory::JitArenaAllocator>::Test
                          (this->liveFloat64Syms,(pSVar2->super_Sym).m_id);
        bVar3 = BVar1 != '\0';
      }
    }
  }
  return bVar3;
}

Assistant:

bool
GlobOptBlockData::IsLive(Sym const * sym) const
{
    sym = StackSym::GetVarEquivStackSym_NoCreate(sym);
    return
        sym &&
        (
        this->liveVarSyms->Test(sym->m_id) ||
        this->liveInt32Syms->Test(sym->m_id) ||
        this->liveFloat64Syms->Test(sym->m_id)
        );
}